

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function
          (Dynamic_Object_Function *this,string *t_type_name,Proxy_Function *t_func,Type_Info *t_ti,
          bool t_is_attribute)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_inner_types;
  pointer local_98;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  byte local_29;
  Type_Info *pTStack_28;
  bool t_is_attribute_local;
  Type_Info *t_ti_local;
  Proxy_Function *t_func_local;
  string *t_type_name_local;
  Dynamic_Object_Function *this_local;
  
  local_29 = t_is_attribute;
  pTStack_28 = t_ti;
  t_ti_local = (Type_Info *)t_func;
  t_func_local = (Proxy_Function *)t_type_name;
  t_type_name_local = (string *)this;
  peVar4 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_func);
  t_inner_types = Proxy_Function_Base::get_param_types(peVar4);
  build_param_types(&local_48,t_inner_types,pTStack_28);
  peVar4 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_ti_local);
  iVar3 = Proxy_Function_Base::get_arity(peVar4);
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_48,iVar3);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_48);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Function_004ac620;
  std::__cxx11::string::string((string *)&this->m_type_name,t_type_name);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (&this->m_func,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)t_ti_local);
  bVar2 = Type_Info::is_undef(pTStack_28);
  if (bVar2) {
    local_98 = (pointer)0x0;
  }
  else {
    local_98 = (pointer)operator_new(0x18);
    local_98->m_type_info = pTStack_28->m_type_info;
    local_98->m_bare_type_info = pTStack_28->m_bare_type_info;
    uVar1 = *(undefined4 *)&pTStack_28->field_0x14;
    local_98->m_flags = pTStack_28->m_flags;
    *(undefined4 *)&local_98->field_0x14 = uVar1;
  }
  std::unique_ptr<chaiscript::Type_Info,std::default_delete<chaiscript::Type_Info>>::
  unique_ptr<std::default_delete<chaiscript::Type_Info>,void>
            ((unique_ptr<chaiscript::Type_Info,std::default_delete<chaiscript::Type_Info>> *)
             &this->m_ti,local_98);
  user_type<chaiscript::dispatch::Dynamic_Object>();
  this->m_is_attribute = (bool)(local_29 & 1);
  peVar4 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_ti_local);
  iVar3 = Proxy_Function_Base::get_arity(peVar4);
  if (iVar3 < 1) {
    peVar4 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)t_ti_local);
    iVar3 = Proxy_Function_Base::get_arity(peVar4);
    bVar2 = false;
    if (-1 < iVar3) goto LAB_00401a5e;
  }
  bVar2 = true;
LAB_00401a5e:
  if (!bVar2) {
    __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                  ,0x3b,
                  "chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function(std::string, const Proxy_Function &, const Type_Info &, bool)"
                 );
  }
  return;
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, const Type_Info &t_ti, bool t_is_attribute = false)
            : Proxy_Function_Base(build_param_types(t_func->get_param_types(), t_ti), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_ti(t_ti.is_undef() ? nullptr : new Type_Info(t_ti))
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }